

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

void htmlParserFinishElementParsing(htmlParserCtxtPtr ctxt)

{
  htmlParserCtxtPtr ctxt_local;
  
  if ((ctxt->node != (xmlNodePtr)0x0) && (ctxt->record_info != 0)) {
    ctxt->nodeInfo->end_pos =
         (unsigned_long)(ctxt->input->cur + (ctxt->input->consumed - (long)ctxt->input->base));
    ctxt->nodeInfo->end_line = (long)ctxt->input->line;
    ctxt->nodeInfo->node = ctxt->node;
    xmlParserAddNodeInfo(ctxt,ctxt->nodeInfo);
    htmlNodeInfoPop(ctxt);
  }
  if (*ctxt->input->cur == '\0') {
    htmlAutoCloseOnEnd(ctxt);
  }
  return;
}

Assistant:

static void
htmlParserFinishElementParsing(htmlParserCtxtPtr ctxt) {
    /*
     * Capture end position and add node
     */
    if ( ctxt->node != NULL && ctxt->record_info ) {
       ctxt->nodeInfo->end_pos = ctxt->input->consumed +
                                (CUR_PTR - ctxt->input->base);
       ctxt->nodeInfo->end_line = ctxt->input->line;
       ctxt->nodeInfo->node = ctxt->node;
       xmlParserAddNodeInfo(ctxt, ctxt->nodeInfo);
       htmlNodeInfoPop(ctxt);
    }
    if (CUR == 0) {
       htmlAutoCloseOnEnd(ctxt);
    }
}